

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall sqvector<SQOuterVar>::~sqvector(sqvector<SQOuterVar> *this)

{
  SQUnsignedInteger in_RDI;
  SQUnsignedInteger i;
  SQOuterVar *this_00;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    for (this_00 = (SQOuterVar *)0x0; this_00 < *(SQOuterVar **)(in_RDI + 8);
        this_00 = (SQOuterVar *)((long)&this_00->_type + 1)) {
      SQOuterVar::~SQOuterVar(this_00);
    }
    sq_vm_free(this_00,in_RDI);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }